

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O1

Object * __thiscall
Lodtalk::Behavior::basicNativeNew(Behavior *this,VMContext *context,size_t indexableSize)

{
  ulong uVar1;
  ulong uVar2;
  ObjectHeader *pOVar3;
  
  uVar1 = (this->format).field_0.uintValue;
  if (((uVar1 & 1) != 0) && (uVar2 = (this->fixedVariableCount).field_0.intValue, (uVar2 & 1) != 0))
  {
    pOVar3 = VMContext::newObject
                       (context,(long)uVar2 >> 1,indexableSize,(ObjectFormat)(uVar1 >> 1),
                        *(uint *)&(this->super_Object).super_ProtoObject.object_header_ >> 10,-1);
    return (Object *)pOVar3;
  }
  __assert_fail("isSmallInteger()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                ,0x200,"SmallIntegerValue Lodtalk::Oop::decodeSmallInteger() const");
}

Assistant:

Object *Behavior::basicNativeNew(VMContext *context, size_t indexableSize)
{
	auto theFormat = (ObjectFormat)format.decodeSmallInteger();
	auto fixedSlotCount = fixedVariableCount.decodeSmallInteger();
	auto classIndex = object_header_.identityHash;
	return reinterpret_cast<Object*> (context->newObject(fixedSlotCount, indexableSize, theFormat, classIndex));
}